

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O0

void __thiscall leveldb::MemEnvTest_DBTest_Test::TestBody(MemEnvTest_DBTest_Test *this)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  char *in_R9;
  Slice SVar6;
  string local_490;
  AssertHelper local_470;
  Message local_468;
  Slice local_460;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__5;
  Message local_430;
  ReadOptions local_428;
  Status local_418;
  char local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_4;
  string res_1;
  size_t i_3;
  Message local_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_3;
  DBImpl *dbi;
  AssertHelper local_378;
  Message local_370;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_330;
  Message local_328;
  undefined1 local_320 [23];
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2d8;
  Message local_2d0;
  Slice local_2c8;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__1;
  size_t i_2;
  _Elt_pointer local_240;
  Iterator *iterator;
  AssertHelper local_218;
  Message local_210;
  Slice local_208;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_;
  Message local_1d8;
  ReadOptions local_1d0;
  Status local_1c0;
  char local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  string res;
  size_t i_1;
  Message local_170;
  WriteOptions local_161;
  Status local_160;
  char local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  size_t i;
  AssertHelper local_130;
  Message local_128;
  allocator local_119;
  string local_118;
  DB local_f8;
  char local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  Slice vals [3];
  Slice keys [3];
  DB *db;
  Options options;
  MemEnvTest_DBTest_Test *this_local;
  
  options.filter_policy = (FilterPolicy *)this;
  Options::Options((Options *)&db);
  options.comparator._0_1_ = 1;
  options._8_8_ = (this->super_MemEnvTest).env_;
  Slice::Slice((Slice *)&vals[2].size_,"aaa");
  Slice::Slice((Slice *)&keys[0].size_,"bbb");
  Slice::Slice((Slice *)&keys[1].size_,"ccc");
  Slice::Slice((Slice *)&gtest_ar.message_,"foo");
  Slice::Slice((Slice *)&vals[0].size_,"bar");
  Slice::Slice((Slice *)&vals[1].size_,"baz");
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"/dir/db",&local_119);
  DB::Open(&local_f8,(Options *)&db,&local_118,(DB **)&keys[2].size_);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_e8,&local_e9,
             (Status *)"DB::Open(options, \"/dir/db\", &db)");
  Status::~Status((Status *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar3) {
    testing::Message::Message(&local_128);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0xe1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  if (bVar3) {
    for (gtest_ar_1.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl =
              (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0;
        (ulong)gtest_ar_1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl < 3;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )((long)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1)) {
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      sVar2 = keys[2].size_;
      memset(&local_161,0,1);
      WriteOptions::WriteOptions(&local_161);
      (**(code **)(*(long *)sVar2 + 0x10))
                (&local_160,sVar2,&local_161,
                 &vals[(long)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 2].size_,
                 &vals[(long)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + -1].size_);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_150,&local_151,
                 (Status *)"db->Put(WriteOptions(), keys[i], vals[i])");
      Status::~Status(&local_160);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
      if (!bVar3) {
        testing::Message::Message(&local_170);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_1,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe3,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_170);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
      if (!bVar3) {
        return;
      }
    }
    for (res.field_2._8_8_ = 0; sVar2 = keys[2].size_, (ulong)res.field_2._8_8_ < 3;
        res.field_2._8_8_ = res.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)&gtest_ar_2.message_);
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      sVar2 = keys[2].size_;
      memset(&local_1d0,0,0x10);
      ReadOptions::ReadOptions(&local_1d0);
      (**(code **)(*(long *)sVar2 + 0x28))
                (&local_1c0,sVar2,&local_1d0,&vals[res.field_2._8_8_ + 2].size_,&gtest_ar_2.message_
                );
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_1b0,&local_1b1,
                 (Status *)"db->Get(ReadOptions(), keys[i], &res)");
      Status::~Status(&local_1c0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar3) {
        testing::Message::Message(&local_1d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        testing::Message::~Message(&local_1d8);
      }
      bVar3 = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      if (!bVar3) {
        Slice::Slice(&local_208,(string *)&gtest_ar_2.message_);
        local_1f1 = leveldb::operator==(&local_208,(Slice *)&vals[res.field_2._8_8_ + -1].size_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar3) {
          testing::Message::Message(&local_210);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&iterator,(internal *)local_1f0,(AssertionResult *)"res == vals[i]",
                     "false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                     ,0xe9,pcVar5);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          std::__cxx11::string::~string((string *)&iterator);
          testing::Message::~Message(&local_210);
        }
        bVar3 = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        if (!bVar3) {
          bVar3 = false;
        }
      }
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      if (bVar3) {
        return;
      }
    }
    memset(&i_2,0,0x10);
    ReadOptions::ReadOptions((ReadOptions *)&i_2);
    local_240 = (_Elt_pointer)(**(code **)(*(long *)sVar2 + 0x30))(sVar2,&i_2);
    (**(code **)&(*local_240)->cv)();
    for (gtest_ar__1.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl =
              (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0;
        (ulong)gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl < 3;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )((long)gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1)) {
      bVar4 = (**(code **)&(*local_240)->sync)();
      local_269 = (bool)(bVar4 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_268,&local_269,(type *)0x0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar3) {
        testing::Message::Message(&local_278);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_268,(AssertionResult *)0x1a8a39
                   ,"false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_280,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xef,pcVar5);
        testing::internal::AssertHelper::operator=(&local_280,&local_278);
        testing::internal::AssertHelper::~AssertHelper(&local_280);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_278);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      if (!bVar3) {
        return;
      }
      lVar1 = (long)gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 2;
      SVar6 = (Slice)(**(code **)&((*local_240)->cv).field_0x28)();
      local_2c8 = SVar6;
      local_2b1 = leveldb::operator==((Slice *)&vals[lVar1].size_,&local_2c8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
      if (!bVar3) {
        testing::Message::Message(&local_2d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_2b0,
                   (AssertionResult *)"keys[i] == iterator->key()","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xf0,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_2d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
      if (!bVar3) {
        return;
      }
      lVar1 = (long)gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + -1;
      SVar6 = (Slice)(*(code *)((*local_240)->cv).mu_)();
      local_320._0_16_ = (undefined1  [16])SVar6;
      local_309 = leveldb::operator==((Slice *)&vals[lVar1].size_,(Slice *)local_320);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_308,&local_309,(type *)0x0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
      if (!bVar3) {
        testing::Message::Message(&local_328);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_308,
                   (AssertionResult *)"vals[i] == iterator->value()","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xf1,pcVar5);
        testing::internal::AssertHelper::operator=(&local_330,&local_328);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_328);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
      if (!bVar3) {
        return;
      }
      (**(code **)&((*local_240)->cv).field_0x18)();
    }
    bVar4 = (**(code **)&(*local_240)->sync)();
    local_361 = (bool)((bVar4 ^ 0xff) & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_360,&local_361,(type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar3) {
      testing::Message::Message(&local_370);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dbi,(internal *)local_360,(AssertionResult *)"!iterator->Valid()",
                 "false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xf4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_378,&local_370);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      std::__cxx11::string::~string((string *)&dbi);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    if (bVar3) {
      if (local_240 != (_Elt_pointer)0x0) {
        (*(code *)(*local_240)->batch)();
      }
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )keys[2].size_;
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      DBImpl::TEST_CompactMemTable((DBImpl *)local_3c0);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_3b0,
                 local_3c0 + 0xf,(Status *)"dbi->TEST_CompactMemTable()");
      Status::~Status((Status *)local_3c0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
      if (!bVar3) {
        testing::Message::Message(&local_3c8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_3,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xf8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_3,&local_3c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_3);
        testing::Message::~Message(&local_3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
      if (bVar3) {
        for (res_1.field_2._8_8_ = 0; (ulong)res_1.field_2._8_8_ < 3;
            res_1.field_2._8_8_ = res_1.field_2._8_8_ + 1) {
          std::__cxx11::string::string((string *)&gtest_ar_4.message_);
          test::IsOK();
          testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
          sVar2 = keys[2].size_;
          memset(&local_428,0,0x10);
          ReadOptions::ReadOptions(&local_428);
          (**(code **)(*(long *)sVar2 + 0x28))
                    (&local_418,sVar2,&local_428,&vals[res_1.field_2._8_8_ + 2].size_,
                     &gtest_ar_4.message_);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_408,
                     &local_409,(Status *)"db->Get(ReadOptions(), keys[i], &res)");
          Status::~Status(&local_418);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
          if (!bVar3) {
            testing::Message::Message(&local_430);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0xfc,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__5.message_,&local_430);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_430);
          }
          bVar3 = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
          if (!bVar3) {
            Slice::Slice(&local_460,(string *)&gtest_ar_4.message_);
            local_449 = leveldb::operator==(&local_460,
                                            (Slice *)&vals[res_1.field_2._8_8_ + -1].size_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_448,&local_449,(type *)0x0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
            if (!bVar3) {
              testing::Message::Message(&local_468);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_490,(internal *)local_448,(AssertionResult *)"res == vals[i]",
                         "false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_470,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                         ,0xfd,pcVar5);
              testing::internal::AssertHelper::operator=(&local_470,&local_468);
              testing::internal::AssertHelper::~AssertHelper(&local_470);
              std::__cxx11::string::~string((string *)&local_490);
              testing::Message::~Message(&local_468);
            }
            bVar3 = !bVar3;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
            if (!bVar3) {
              bVar3 = false;
            }
          }
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          if (bVar3) {
            return;
          }
        }
        if (keys[2].size_ != 0) {
          (**(code **)(*(long *)keys[2].size_ + 8))();
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(MemEnvTest, DBTest) {
  Options options;
  options.create_if_missing = true;
  options.env = env_;
  DB* db;

  const Slice keys[] = {Slice("aaa"), Slice("bbb"), Slice("ccc")};
  const Slice vals[] = {Slice("foo"), Slice("bar"), Slice("baz")};

  ASSERT_LEVELDB_OK(DB::Open(options, "/dir/db", &db));
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_LEVELDB_OK(db->Put(WriteOptions(), keys[i], vals[i]));
  }

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  Iterator* iterator = db->NewIterator(ReadOptions());
  iterator->SeekToFirst();
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_TRUE(iterator->Valid());
    ASSERT_TRUE(keys[i] == iterator->key());
    ASSERT_TRUE(vals[i] == iterator->value());
    iterator->Next();
  }
  ASSERT_TRUE(!iterator->Valid());
  delete iterator;

  DBImpl* dbi = reinterpret_cast<DBImpl*>(db);
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  delete db;
}